

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O3

bool VerifyCharacterVector
               (Verifier *verifier,Vector<flatbuffers::Offset<void>,_unsigned_int> *values,
               Vector<unsigned_char,_unsigned_int> *types)

{
  ulong uVar1;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *str;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  if (values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 ||
      types == (Vector<unsigned_char,_unsigned_int> *)0x0) {
    bVar4 = values == (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0 &&
            types == (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else if (*(int *)values == *(int *)types) {
    if (*(int *)values != 0) {
      uVar3 = 0;
      uVar1 = 0;
      do {
        if (*(uint *)types <= uVar1) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                       );
        }
        if ((byte)types[uVar1 + 4] - 1 < 6) {
          str = values + (ulong)*(uint *)(values + (ulong)uVar3 + 4) + (ulong)uVar3 + 4;
          switch((uint)(byte)types[uVar1 + 4]) {
          case 1:
            bVar4 = Attacker::Verify((Attacker *)str,verifier);
            break;
          default:
            uVar2 = (long)str - (long)verifier->buf_;
            if (((uVar2 & 3) == 0) || (((verifier->opts_).check_alignment & 1U) == 0)) {
              if (verifier->size_ < 5) {
                return false;
              }
              if (verifier->size_ - 4 < uVar2) {
                return false;
              }
              goto LAB_0019b12f;
            }
            goto LAB_0019b14e;
          case 5:
          case 6:
            bVar4 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,(String *)str);
          }
          if (bVar4 == false) goto LAB_0019b14e;
        }
LAB_0019b12f:
        uVar1 = uVar1 + 1;
        uVar3 = uVar3 + 4;
      } while (uVar1 < *(uint *)values);
    }
    bVar4 = true;
  }
  else {
LAB_0019b14e:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool VerifyCharacterVector(::flatbuffers::Verifier &verifier, const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, const ::flatbuffers::Vector<uint8_t> *types) {
  if (!values || !types) return !values && !types;
  if (values->size() != types->size()) return false;
  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {
    if (!VerifyCharacter(
        verifier,  values->Get(i), types->GetEnum<Character>(i))) {
      return false;
    }
  }
  return true;
}